

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

uint getChompedLineBreaks(char ChompingIndicator,uint LineBreaks,StringRef Str)

{
  uint LineBreaks_local;
  char ChompingIndicator_local;
  StringRef Str_local;
  
  if (ChompingIndicator == '-') {
    Str_local.Length._4_4_ = 0;
  }
  else {
    Str_local.Length._4_4_ = LineBreaks;
    if (ChompingIndicator != '+') {
      Str_local.Length._4_4_ = (uint)(Str.Length != 0);
    }
  }
  return Str_local.Length._4_4_;
}

Assistant:

static unsigned getChompedLineBreaks(char ChompingIndicator,
                                     unsigned LineBreaks, StringRef Str) {
  if (ChompingIndicator == '-') // Strip all line breaks.
    return 0;
  if (ChompingIndicator == '+') // Keep all line breaks.
    return LineBreaks;
  // Clip trailing lines.
  return Str.empty() ? 0 : 1;
}